

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

AMQP_MESSENGER_DISPOSITION_RESULT
on_amqp_message_received_callback
          (MESSAGE_HANDLE message,AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
          void *context)

{
  TWIN_STATE_UPDATE_CALLBACK p_Var1;
  bool bVar2;
  int iVar3;
  AMQP_TYPE AVar4;
  LOGGER_LOG p_Var5;
  LIST_ITEM_HANDLE item_handle;
  TWIN_OPERATION_CONTEXT *op_ctx;
  TWIN_MESSENGER_REPORT_STATE_COMPLETE_CALLBACK p_Var6;
  _Bool *p_Var7;
  void *pvVar8;
  TWIN_REPORT_STATE_REASON TVar9;
  TWIN_REPORT_STATE_RESULT TVar10;
  AMQP_MESSENGER_DISPOSITION_RESULT AVar11;
  char *pcVar12;
  uint index;
  ulong uVar13;
  _Bool has_status_code;
  _Bool has_version;
  char *correlation_id;
  int status_code;
  AMQP_VALUE amqp_map_value;
  BINARY_DATA twin_report;
  AMQP_VALUE amqp_value;
  int local_54;
  MESSAGE_BODY_TYPE body_type;
  undefined4 uStack_4c;
  uint32_t pair_count;
  TWIN_MESSENGER_INSTANCE_conflict *local_40;
  int64_t version;
  
  if (message == (MESSAGE_HANDLE)0x0 || context == (void *)0x0) {
    p_Var5 = xlogging_get_log_function();
    AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    pcVar12 = "Invalid argument (message=%p, context=%p)";
    iVar3 = 0x544;
    goto LAB_00138763;
  }
  amqp_messenger_destroy_disposition_info(disposition_info);
  iVar3 = message_get_properties(message,(PROPERTIES_HANDLE *)&twin_report);
  if (iVar3 == 0) {
    if (twin_report.bytes == (uchar *)0x0) {
      correlation_id = (char *)0x0;
    }
    else {
      iVar3 = properties_get_correlation_id((PROPERTIES_HANDLE)twin_report.bytes,&amqp_value);
      if (amqp_value != (AMQP_VALUE)0x0 && iVar3 == 0) {
        iVar3 = amqpvalue_get_string(amqp_value,(char **)&amqp_map_value);
        if (iVar3 == 0) {
          iVar3 = mallocAndStrcpy_s(&correlation_id,(char *)amqp_map_value);
          if (iVar3 == 0) goto LAB_0013809b;
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar12 = "Failed cloning correlation-id";
            iVar3 = 0xfa;
            goto LAB_001381e4;
          }
        }
        else {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar12 = "Failed retrieving string from AMQP value";
            iVar3 = 0xf5;
LAB_001381e4:
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"get_message_correlation_id",iVar3,1,pcVar12);
          }
        }
        properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
        goto LAB_001381f3;
      }
      correlation_id = (char *)0x0;
LAB_0013809b:
      properties_destroy((PROPERTIES_HANDLE)twin_report.bytes);
    }
    iVar3 = message_get_message_annotations(message,&amqp_value);
    if (iVar3 != 0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0013871b;
      pcVar12 = "Failed getting TWIN message annotations";
      iVar3 = 0x1fa;
LAB_001380f3:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"parse_incoming_twin_message",iVar3,1,pcVar12);
LAB_0013871b:
      free(correlation_id);
      correlation_id = (char *)0x0;
      goto LAB_0013872b;
    }
    if (amqp_value != (AMQP_VALUE)0x0) {
      iVar3 = amqpvalue_get_map_pair_count(amqp_value,&pair_count);
      if (iVar3 == 0) {
        has_status_code = false;
        has_version = false;
        local_54 = 0;
        uVar13 = 0;
        local_40 = (TWIN_MESSENGER_INSTANCE_conflict *)context;
        while (index = (uint)uVar13, index < pair_count) {
          iVar3 = amqpvalue_get_map_key_value_pair
                            (amqp_value,index,(AMQP_VALUE *)&twin_report,&amqp_map_value);
          if (iVar3 == 0) {
            iVar3 = amqpvalue_get_symbol((AMQP_VALUE)twin_report.bytes,(char **)&body_type);
            if (iVar3 == 0) {
              pcVar12 = (char *)CONCAT44(uStack_4c,body_type);
              iVar3 = strcmp("status",pcVar12);
              if (iVar3 == 0) {
                AVar4 = amqpvalue_get_type(amqp_map_value);
                if (AVar4 == AMQP_TYPE_INT) {
                  iVar3 = amqpvalue_get_int(amqp_map_value,&status_code);
                  p_Var7 = &has_status_code;
                  if (iVar3 == 0) {
LAB_001383c4:
                    *p_Var7 = true;
                    goto LAB_001383c7;
                  }
                  p_Var5 = xlogging_get_log_function();
                  context = local_40;
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00138711;
                  pcVar12 = "Failed getting TWIN message status code value";
                  iVar3 = 0x235;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  context = local_40;
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00138711;
                  pcVar12 = "TWIN message status property expected to be INT";
                  iVar3 = 0x22f;
                }
              }
              else {
                iVar3 = strcmp("version",pcVar12);
                if (iVar3 != 0) {
LAB_001383c7:
                  amqpvalue_destroy(amqp_map_value);
                  amqpvalue_destroy((AMQP_VALUE)twin_report.bytes);
                  goto LAB_001383db;
                }
                AVar4 = amqpvalue_get_type(amqp_map_value);
                if (AVar4 == AMQP_TYPE_LONG) {
                  iVar3 = amqpvalue_get_long(amqp_map_value,&version);
                  p_Var7 = &has_version;
                  if (iVar3 == 0) goto LAB_001383c4;
                  p_Var5 = xlogging_get_log_function();
                  context = local_40;
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00138711;
                  pcVar12 = "Failed getting TWIN message version value";
                  iVar3 = 0x248;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  context = local_40;
                  if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00138711;
                  pcVar12 = "TWIN message version property expected to be LONG";
                  iVar3 = 0x242;
                }
              }
            }
            else {
              p_Var5 = xlogging_get_log_function();
              context = local_40;
              if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_00138711;
              pcVar12 = "Failed getting AMQP value symbol";
              iVar3 = 0x225;
            }
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"parse_incoming_twin_message",iVar3,1,pcVar12);
            context = local_40;
            goto LAB_00138711;
          }
          p_Var5 = xlogging_get_log_function();
          local_54 = 0x21d;
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                      ,"parse_incoming_twin_message",0x21c,1,
                      "Failed getting AMQP map key/value pair (%d)",uVar13);
          }
LAB_001383db:
          uVar13 = (ulong)(index + 1);
        }
        amqpvalue_destroy(amqp_value);
        context = local_40;
        if (local_54 == 0) goto LAB_00138238;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"parse_incoming_twin_message",0x20b,1,
                    "Failed getting TWIN message annotations count");
        }
LAB_00138711:
        amqpvalue_destroy(amqp_value);
      }
      goto LAB_0013871b;
    }
    has_version = false;
    has_status_code = false;
LAB_00138238:
    iVar3 = message_get_body_type(message,&body_type);
    if (iVar3 != 0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 != (LOGGER_LOG)0x0) {
        pcVar12 = "Failed getting TWIN message body type";
        iVar3 = 0x263;
        goto LAB_001380f3;
      }
      goto LAB_0013871b;
    }
    if (body_type != MESSAGE_BODY_TYPE_NONE) {
      if (body_type == MESSAGE_BODY_TYPE_DATA) {
        iVar3 = message_get_body_amqp_data_count(message,(size_t *)&amqp_map_value);
        if (iVar3 == 0) {
          if (amqp_map_value == (AMQP_VALUE)0x1) {
            iVar3 = message_get_body_amqp_data_in_place(message,0,&twin_report);
            if (iVar3 == 0) {
              bVar2 = true;
              if (correlation_id == (char *)0x0) {
                if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->on_message_received_callback ==
                    (TWIN_STATE_UPDATE_CALLBACK)0x0) {
                  return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
                }
                (*((TWIN_MESSENGER_INSTANCE_conflict *)context)->on_message_received_callback)
                          (TWIN_UPDATE_TYPE_PARTIAL,(char *)twin_report.bytes,twin_report.length,
                           ((TWIN_MESSENGER_INSTANCE_conflict *)context)->
                           on_message_received_context);
                return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
              }
              goto LAB_00138470;
            }
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar12 = "Failed getting TWIN message body";
              iVar3 = 0x276;
              goto LAB_001380f3;
            }
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              pcVar12 = "Unexpected number of TWIN message bodies (%lu)";
              iVar3 = 0x271;
              goto LAB_00138527;
            }
          }
        }
        else {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            pcVar12 = "Failed getting TWIN message body count";
            iVar3 = 0x26c;
            goto LAB_001380f3;
          }
        }
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          amqp_map_value = (AMQP_VALUE)(ulong)body_type;
          pcVar12 = "Unexpected TWIN message body %d";
          iVar3 = 0x280;
LAB_00138527:
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"parse_incoming_twin_message",iVar3,1,pcVar12,amqp_map_value);
        }
      }
      goto LAB_0013871b;
    }
    if (correlation_id != (char *)0x0) {
      bVar2 = false;
LAB_00138470:
      item_handle = singlylinkedlist_find
                              (((TWIN_MESSENGER_INSTANCE_conflict *)context)->operations,
                               find_twin_operation_by_correlation_id,correlation_id);
      if (item_handle == (LIST_ITEM_HANDLE)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) {
          AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x566,1,
                    "Could not find context of TWIN incoming message (%s, %s)",
                    ((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
        }
        goto LAB_00138ba4;
      }
      op_ctx = (TWIN_OPERATION_CONTEXT *)singlylinkedlist_item_get_value(item_handle);
      if (op_ctx == (TWIN_OPERATION_CONTEXT *)0x0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) {
          AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        }
        else {
          AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x56e,1,
                    "Could not get context for incoming TWIN message (%s, %s)",
                    ((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
        }
      }
      else {
        AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
        switch(op_ctx->type) {
        case TWIN_OPERATION_TYPE_PATCH:
          if (has_status_code == false) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x576,1,
                        "Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)"
                        ,((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
            }
            p_Var6 = (op_ctx->cb).reported_properties.callback;
            AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (p_Var6 != (TWIN_MESSENGER_REPORT_STATE_COMPLETE_CALLBACK)0x0) {
              pvVar8 = (op_ctx->cb).reported_properties.context;
              TVar10 = TWIN_REPORT_STATE_RESULT_ERROR;
              TVar9 = TWIN_REPORT_STATE_REASON_INVALID_RESPONSE;
              status_code = 0;
              goto LAB_00138a3b;
            }
          }
          else {
            p_Var6 = (op_ctx->cb).reported_properties.callback;
            if (p_Var6 != (TWIN_MESSENGER_REPORT_STATE_COMPLETE_CALLBACK)0x0) {
              pvVar8 = (op_ctx->cb).reported_properties.context;
              TVar10 = TWIN_REPORT_STATE_RESULT_SUCCESS;
              TVar9 = TWIN_REPORT_STATE_REASON_NONE;
LAB_00138a3b:
              (*p_Var6)(TVar10,TVar9,status_code,pvVar8);
            }
          }
          break;
        case TWIN_OPERATION_TYPE_GET:
          if (bVar2) {
            p_Var1 = op_ctx->msgr->on_message_received_callback;
            if (p_Var1 != (TWIN_STATE_UPDATE_CALLBACK)0x0) {
              (*p_Var1)(TWIN_UPDATE_TYPE_COMPLETE,(char *)twin_report.bytes,twin_report.length,
                        op_ctx->msgr->on_message_received_context);
            }
            if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
                TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES) {
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state =
                   TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_error_count = 0;
            }
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x58b,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
            }
            p_Var1 = op_ctx->msgr->on_message_received_callback;
            if (p_Var1 != (TWIN_STATE_UPDATE_CALLBACK)0x0) {
              (*p_Var1)(TWIN_UPDATE_TYPE_COMPLETE,(char *)0x0,0,
                        op_ctx->msgr->on_message_received_context);
            }
            AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
            if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
                TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES) {
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state =
                   TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
LAB_00138b42:
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_error_count =
                   ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_error_count + 1;
            }
          }
          break;
        case TWIN_OPERATION_TYPE_GET_ON_DEMAND:
          if (bVar2) {
            (*(op_ctx->cb).reported_properties.callback)
                      (TWIN_REPORT_STATE_RESULT_ERROR,(TWIN_REPORT_STATE_REASON)twin_report.bytes,
                       (int)twin_report.length,(op_ctx->cb).reported_properties.context);
          }
          else {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                        ,"on_amqp_message_received_callback",0x5ac,1,
                        "Received an incoming TWIN message for a GET operation, but with no report (%s, %s)"
                        ,((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
            }
            (*(op_ctx->cb).reported_properties.callback)
                      (TWIN_REPORT_STATE_RESULT_ERROR,TWIN_REPORT_STATE_REASON_NONE,0,
                       (op_ctx->cb).reported_properties.context);
            AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
          }
          break;
        case TWIN_OPERATION_TYPE_PUT:
          if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
              TWIN_SUBSCRIPTION_STATE_SUBSCRIBED) {
            if (has_status_code == false) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5bf,1,
                          "Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)"
                          ,((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
              }
            }
            else {
              if (0xffffff9b < status_code - 300U) break;
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5c5,1,
                          "Received status code %d for TWIN subscription request (%s, %s)",
                          (ulong)(uint)status_code,
                          ((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
              }
            }
            if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
                TWIN_SUBSCRIPTION_STATE_SUBSCRIBING) {
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state =
                   TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
              goto LAB_00138b42;
            }
          }
          break;
        case TWIN_OPERATION_TYPE_DELETE:
          if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
              TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED) {
            if (has_status_code == false) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e1,1,
                          "Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)"
                          ,((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
              }
            }
            else {
              if (0xffffff9b < status_code - 300U) break;
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                          ,"on_amqp_message_received_callback",0x5e7,1,
                          "Received status code %d for TWIN unsubscription request (%s, %s)",
                          (ulong)(uint)status_code,
                          ((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
              }
            }
            if (((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state ==
                TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING) {
              ((TWIN_MESSENGER_INSTANCE_conflict *)context)->subscription_state =
                   TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
              goto LAB_00138b42;
            }
          }
        }
        destroy_twin_operation_context(op_ctx);
      }
      iVar3 = singlylinkedlist_remove
                        (((TWIN_MESSENGER_INSTANCE_conflict *)context)->operations,item_handle);
      if (iVar3 != 0) {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                    ,"on_amqp_message_received_callback",0x602,1,
                    "Failed removing context for incoming TWIN message (%s, %s)",
                    ((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id,correlation_id);
        }
        update_state((TWIN_MESSENGER_INSTANCE_conflict *)context,TWIN_MESSENGER_STATE_ERROR);
      }
LAB_00138ba4:
      free(correlation_id);
      return AVar11;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar12 = "Received TWIN message with no correlation-id and no report (%s)";
    iVar3 = 0x615;
  }
  else {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"get_message_correlation_id",0xe0,1,"Failed getting AMQP message properties");
    }
LAB_001381f3:
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"parse_incoming_twin_message",0x1f1,1,
                "Failed retrieving correlation ID from received TWIN message.");
    }
LAB_0013872b:
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
    }
    pcVar12 = "Failed parsing incoming TWIN message (%s)";
    iVar3 = 0x55b;
  }
  AVar11 = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;
  message = (MESSAGE_HANDLE)((TWIN_MESSENGER_INSTANCE_conflict *)context)->device_id;
LAB_00138763:
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
            ,"on_amqp_message_received_callback",iVar3,1,pcVar12,message);
  return AVar11;
}

Assistant:

static AMQP_MESSENGER_DISPOSITION_RESULT on_amqp_message_received_callback(MESSAGE_HANDLE message, AMQP_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, void* context)
{

    AMQP_MESSENGER_DISPOSITION_RESULT disposition_result;

    if (message == NULL || context == NULL)
    {
        LogError("Invalid argument (message=%p, context=%p)", message, context);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)context;

        char* correlation_id;

        bool has_status_code;
        int status_code;

        bool has_version;
        int64_t version;

        bool has_twin_report;
        BINARY_DATA twin_report;

        amqp_messenger_destroy_disposition_info(disposition_info);
        disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_ACCEPTED;

        if (parse_incoming_twin_message(message, &correlation_id, &has_version, &version, &has_status_code, &status_code, &has_twin_report, &twin_report) != 0)
        {
            LogError("Failed parsing incoming TWIN message (%s)", twin_msgr->device_id);
        }
        else
        {
            if (correlation_id != NULL)
            {
                // It is supposed to be a request sent previously (reported properties PATCH, GET, PUT or DELETE).

                LIST_ITEM_HANDLE list_item;
                if ((list_item = singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_correlation_id, (const void*)correlation_id)) == NULL)
                {
                    LogError("Could not find context of TWIN incoming message (%s, %s)", twin_msgr->device_id, correlation_id);
                }
                else
                {
                    TWIN_OPERATION_CONTEXT* twin_op_ctx;

                    if ((twin_op_ctx = (TWIN_OPERATION_CONTEXT*)singlylinkedlist_item_get_value(list_item)) == NULL)
                    {
                        LogError("Could not get context for incoming TWIN message (%s, %s)", twin_msgr->device_id, correlation_id);
                    }
                    else
                    {
                        if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
                        {
                            if (!has_status_code)
                            {
                                LogError("Received an incoming TWIN message for a PATCH operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_ERROR, TWIN_REPORT_STATE_REASON_INVALID_RESPONSE, 0, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                                {
                                    twin_op_ctx->cb.reported_properties.callback(TWIN_REPORT_STATE_RESULT_SUCCESS, TWIN_REPORT_STATE_REASON_NONE, status_code, twin_op_ctx->cb.reported_properties.context);
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                                    twin_msgr->subscription_error_count++;
                                }
                            }
                            else
                            {
                                if (twin_op_ctx->msgr->on_message_received_callback != NULL)
                                {
                                    twin_op_ctx->msgr->on_message_received_callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->msgr->on_message_received_context);
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                                {
                                    twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                    twin_msgr->subscription_error_count = 0;
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
                        {
                            if (!has_twin_report)
                            {
                                LogError("Received an incoming TWIN message for a GET operation, but with no report (%s, %s)", twin_msgr->device_id, correlation_id);

                                disposition_result = AMQP_MESSENGER_DISPOSITION_RESULT_REJECTED;

                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, twin_op_ctx->cb.get_twin.context);
                            }
                            else
                            {
                                twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, (const char*)twin_report.bytes, twin_report.length, twin_op_ctx->cb.get_twin.context);
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBED)
                            {
                                bool subscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a PUT operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN subscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    subscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_SUBSCRIBING)
                                {
                                    if (subscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_SUBSCRIBE_FOR_UPDATES;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }
                        else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_DELETE)
                        {
                            if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED)
                            {
                                bool unsubscription_succeeded = true;

                                if (!has_status_code)
                                {
                                    LogError("Received an incoming TWIN message for a DELETE operation, but with no status code (%s, %s)", twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }
                                else if (status_code < 200 || status_code >= 300)
                                {
                                    LogError("Received status code %d for TWIN unsubscription request (%s, %s)", status_code, twin_msgr->device_id, correlation_id);

                                    unsubscription_succeeded = false;
                                }

                                if (twin_msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBING)
                                {
                                    if (unsubscription_succeeded)
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_NOT_SUBSCRIBED;
                                        twin_msgr->subscription_error_count = 0;
                                    }
                                    else
                                    {
                                        twin_msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_UNSUBSCRIBE;
                                        twin_msgr->subscription_error_count++;
                                    }
                                }
                            }
                        }

                        destroy_twin_operation_context(twin_op_ctx);
                    }

                    if (singlylinkedlist_remove(twin_msgr->operations, list_item) != 0)
                    {
                        LogError("Failed removing context for incoming TWIN message (%s, %s)",
                            twin_msgr->device_id, correlation_id);

                        update_state(twin_msgr, TWIN_MESSENGER_STATE_ERROR);
                    }
                }

                free(correlation_id);
            }
            else if (has_twin_report)
            {
                // It is supposed to be a desired properties delta update.

                if (twin_msgr->on_message_received_callback != NULL)
                {
                    twin_msgr->on_message_received_callback(TWIN_UPDATE_TYPE_PARTIAL, (const char*)twin_report.bytes, twin_report.length, twin_msgr->on_message_received_context);
                }
            }
            else
            {
                LogError("Received TWIN message with no correlation-id and no report (%s)", twin_msgr->device_id);
            }
        }
    }

    return disposition_result;
}